

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_data.cc
# Opt level: O3

int CRYPTO_set_ex_data(CRYPTO_EX_DATA *ad,int idx,void *val)

{
  ulong i;
  OPENSSL_STACK *sk;
  size_t sVar1;
  long lVar2;
  
  if (idx < 0) {
    abort();
  }
  i = (ulong)(uint)idx;
  sk = (OPENSSL_STACK *)ad->sk;
  if (sk == (OPENSSL_STACK *)0x0) {
    sk = OPENSSL_sk_new_null();
    ad->sk = (stack_st_void *)sk;
    if (sk == (OPENSSL_STACK *)0x0) {
      return 0;
    }
  }
  sVar1 = OPENSSL_sk_num(sk);
  if (sVar1 <= i) {
    lVar2 = (i - sVar1) + 1;
    do {
      sVar1 = OPENSSL_sk_push((OPENSSL_STACK *)ad->sk,(void *)0x0);
      if (sVar1 == 0) {
        return 0;
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  OPENSSL_sk_set((OPENSSL_STACK *)ad->sk,i,val);
  return 1;
}

Assistant:

int CRYPTO_set_ex_data(CRYPTO_EX_DATA *ad, int index, void *val) {
  if (index < 0) {
    // A caller that can accidentally pass in an invalid index into this
    // function will hit an memory error if |index| happened to be valid, and
    // expected |val| to be of a different type.
    abort();
  }

  if (ad->sk == NULL) {
    ad->sk = sk_void_new_null();
    if (ad->sk == NULL) {
      return 0;
    }
  }

  // Add NULL values until the stack is long enough.
  for (size_t i = sk_void_num(ad->sk); i <= (size_t)index; i++) {
    if (!sk_void_push(ad->sk, NULL)) {
      return 0;
    }
  }

  sk_void_set(ad->sk, (size_t)index, val);
  return 1;
}